

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O0

void __thiscall absl::lts_20240722::FlagSaver::~FlagSaver(FlagSaver *this)

{
  FlagSaverImpl *this_00;
  FlagSaver *this_local;
  
  if (this->impl_ != (FlagSaverImpl *)0x0) {
    flags_internal::FlagSaverImpl::RestoreToRegistry(this->impl_);
    this_00 = this->impl_;
    if (this_00 != (FlagSaverImpl *)0x0) {
      flags_internal::FlagSaverImpl::~FlagSaverImpl(this_00);
      operator_delete(this_00,0x18);
    }
  }
  return;
}

Assistant:

FlagSaver::~FlagSaver() {
  if (!impl_) return;

  impl_->RestoreToRegistry();
  delete impl_;
}